

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat_begin_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::repeat_begin_matcher::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (repeat_begin_matcher *this,
          match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *state,matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *next)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  sub_match_impl *psVar4;
  int iVar5;
  
  iVar2 = this->mark_number_;
  psVar4 = state->sub_matches_;
  uVar3 = *(undefined4 *)
           &psVar4[iVar2].
            super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .field_0x14;
  bVar1 = psVar4[iVar2].zero_width_;
  *(undefined4 *)
   &psVar4[iVar2].
    super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .field_0x14 = 1;
  psVar4[iVar2].zero_width_ = false;
  iVar5 = (*(next->
            super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._vptr_matchable[2])(next);
  if (SUB41(iVar5,0) == false) {
    *(undefined4 *)
     &psVar4[iVar2].
      super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .field_0x14 = uVar3;
    psVar4[iVar2].zero_width_ = bVar1;
  }
  return SUB41(iVar5,0);
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            sub_match_impl<BidiIter> &br = state.sub_match(this->mark_number_);

            unsigned int old_repeat_count = br.repeat_count_;
            bool old_zero_width = br.zero_width_;

            br.repeat_count_ = 1;
            br.zero_width_ = false;

            // "push" next onto the stack, so it can be "popped" in
            // repeat_end_matcher and used to loop back.
            if(next.BOOST_NESTED_TEMPLATE push_match<Next>(state))
            {
                return true;
            }

            br.repeat_count_ = old_repeat_count;
            br.zero_width_ = old_zero_width;

            return false;
        }